

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O0

int __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::remove
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,char *__filename)

{
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *pDVar1;
  Element<soplex::NameSet::Name,_soplex::DataKey> *pEVar2;
  int in_EDX;
  int i;
  int in_stack_ffffffffffffffdc;
  
  pDVar1 = (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *)index(this,__filename,in_EDX);
  if (-1 < (int)pDVar1) {
    pDVar1 = this;
    pEVar2 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
             ::operator[](&this->m_elem,in_stack_ffffffffffffffdc);
    pEVar2->stat = RELEASED;
    pDVar1->m_used = pDVar1->m_used + -1;
  }
  return (int)pDVar1;
}

Assistant:

void remove(const HashItem& h)
   {
      int i = index(h);

      if(i < 0)
         return;

      m_elem[i].stat = Elem::RELEASED;
      m_used--;
      assert(!has(h));
   }